

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O3

type llvm::hashing::detail::hash_combine_range_impl<unsigned_int_const>(uint *first,uint *last)

{
  type tVar1;
  long lVar2;
  ulong length;
  uint *s;
  hash_state state;
  hash_state local_60;
  
  if (get_execution_seed()::seed == '\0') {
    hash_combine_range_impl<unsigned_int_const>();
  }
  length = (long)last - (long)first;
  if (length < 0x41) {
    tVar1.value = hash_short((char *)first,length,get_execution_seed()::seed);
    return (type)tVar1.value;
  }
  hash_state::create(&local_60,(char *)first,get_execution_seed()::seed);
  if ((length & 0xffffffffffffffc0) != 0x40) {
    s = first + 0x10;
    lVar2 = (length & 0xffffffffffffffc0) - 0x40;
    do {
      hash_state::mix(&local_60,(char *)s);
      s = s + 0x10;
      lVar2 = lVar2 + -0x40;
    } while (lVar2 != 0);
  }
  if ((length & 0x3f) != 0) {
    hash_state::mix(&local_60,(char *)(last + -0x10));
  }
  tVar1.value = hash_state::finalize(&local_60,length);
  return (type)tVar1.value;
}

Assistant:

typename std::enable_if<is_hashable_data<ValueT>::value, hash_code>::type
hash_combine_range_impl(ValueT *first, ValueT *last) {
  const uint64_t seed = get_execution_seed();
  const char *s_begin = reinterpret_cast<const char *>(first);
  const char *s_end = reinterpret_cast<const char *>(last);
  const size_t length = std::distance(s_begin, s_end);
  if (length <= 64)
    return hash_short(s_begin, length, seed);

  const char *s_aligned_end = s_begin + (length & ~63);
  hash_state state = state.create(s_begin, seed);
  s_begin += 64;
  while (s_begin != s_aligned_end) {
    state.mix(s_begin);
    s_begin += 64;
  }
  if (length & 63)
    state.mix(s_end - 64);

  return state.finalize(length);
}